

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

Result __thiscall
soplex::SPxMainSM<double>::multiaggregation
          (SPxMainSM<double> *this,SPxLPBase<double> *lp,bool *again)

{
  int *piVar1;
  Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *this_00;
  int iVar2;
  int p_dimen;
  uint uVar3;
  Nonzero<double> *pNVar4;
  pointer pdVar5;
  bool bVar6;
  bool bVar7;
  SPxSimplifier<double> *pSVar8;
  int iVar9;
  int iVar10;
  double *pdVar11;
  VectorBase<double> *pVVar12;
  MultiAggregationPS *this_01;
  SPxOut *pSVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  Item *this_02;
  int l;
  uint uVar18;
  int k;
  int t;
  ulong uVar19;
  long lVar20;
  int l_1;
  Item *pIVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double minVal;
  uint local_124;
  ulong local_120;
  ulong local_118;
  double maxVal;
  int local_104;
  double local_100;
  double local_f8;
  double local_f0;
  SPxMainSM<double> *local_e8;
  double minRes;
  double local_c8;
  double maxRes;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  VectorBase<double> downLocks;
  VectorBase<double> upLocks;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  iVar2 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  p_dimen = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  VectorBase<double>::VectorBase(&upLocks,p_dimen);
  VectorBase<double>::VectorBase
            (&downLocks,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  pSVar8 = &this->super_SPxSimplifier<double>;
  this_00 = &this->m_hist;
  local_118 = 0;
  local_104 = 0;
  uVar19 = (ulong)(uint)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_e8 = this;
  do {
    do {
      do {
        iVar10 = local_104;
        if ((int)uVar19 < 1) {
          iVar9 = local_104 * 2;
          if (iVar9 != 0) {
            piVar1 = &(this->super_SPxSimplifier<double>).m_remRows;
            *piVar1 = *piVar1 + local_104;
            piVar1 = &(this->super_SPxSimplifier<double>).m_remCols;
            *piVar1 = *piVar1 + local_104;
            piVar1 = &(this->super_SPxSimplifier<double>).m_remNzos;
            t = (int)local_118;
            *piVar1 = *piVar1 + t;
            pSVar13 = (this->super_SPxSimplifier<double>).spxout;
            if ((pSVar13 != (SPxOut *)0x0) && (3 < (int)pSVar13->m_verbosity)) {
              minRes = (double)CONCAT44(minRes._4_4_,pSVar13->m_verbosity);
              maxRes = (double)CONCAT44(maxRes._4_4_,4);
              (*pSVar13->_vptr_SPxOut[2])();
              pSVar13 = soplex::operator<<((this->super_SPxSimplifier<double>).spxout,
                                           "Simplifier (multi-aggregation) removed ");
              pSVar13 = soplex::operator<<(pSVar13,iVar10);
              pSVar13 = soplex::operator<<(pSVar13," rows, ");
              pSVar13 = soplex::operator<<(pSVar13,iVar10);
              pSVar13 = soplex::operator<<(pSVar13," cols, ");
              pSVar13 = soplex::operator<<(pSVar13,t);
              pSVar13 = soplex::operator<<(pSVar13," non-zeros");
              std::endl<char,std::char_traits<char>>(pSVar13->m_streams[pSVar13->m_verbosity]);
              pSVar13 = (this->super_SPxSimplifier<double>).spxout;
              (*pSVar13->_vptr_SPxOut[2])(pSVar13,&minRes);
            }
            if ((double)(p_dimen + iVar2) * (this->super_SPxSimplifier<double>).m_minReduction <
                (double)iVar9) {
              *again = true;
            }
          }
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    ((_Vector_base<double,_std::allocator<double>_> *)&downLocks);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    ((_Vector_base<double,_std::allocator<double>_> *)&upLocks);
          return OKAY;
        }
        uVar19 = uVar19 - 1;
        uVar15 = uVar19 & 0xffffffff;
        upLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar15] = 0.0;
        downLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar15] = 0.0;
        pIVar21 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
        iVar10 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[uVar15].idx;
        iVar9 = pIVar21[iVar10].data.super_SVectorBase<double>.memused;
      } while (iVar9 < 2);
      pIVar21 = pIVar21 + iVar10;
      lVar17 = 8;
      local_120 = uVar19;
      for (lVar20 = 0; lVar20 < iVar9; lVar20 = lVar20 + 1) {
        pNVar4 = (pIVar21->data).super_SVectorBase<double>.m_elem;
        dVar24 = *(double *)((long)pNVar4 + lVar17 + -8);
        dVar25 = (lp->super_LPRowSetBase<double>).left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[*(int *)((long)&pNVar4->val + lVar17)];
        pdVar11 = (double *)infinity();
        if ((dVar25 <= -*pdVar11) ||
           (dVar25 = (lp->super_LPRowSetBase<double>).right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [*(int *)((long)&((pIVar21->data).super_SVectorBase<double>.m_elem)->val +
                              lVar17)], pdVar11 = (double *)infinity(), *pdVar11 <= dVar25)) {
          dVar25 = (lp->super_LPRowSetBase<double>).left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [*(int *)((long)&((pIVar21->data).super_SVectorBase<double>.m_elem)->val + lVar17
                            )];
          pdVar11 = (double *)infinity();
          if (-*pdVar11 < dVar25) {
            pVVar12 = &downLocks;
            if (dVar24 <= 0.0) {
              pVVar12 = &upLocks;
joined_r0x001ebaf6:
              if (0.0 <= dVar24) goto LAB_001ebb12;
            }
            goto LAB_001ebaf8;
          }
          dVar25 = (lp->super_LPRowSetBase<double>).right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [*(int *)((long)&((pIVar21->data).super_SVectorBase<double>.m_elem)->val + lVar17
                            )];
          pdVar11 = (double *)infinity();
          if (dVar25 < *pdVar11) {
            pVVar12 = &upLocks;
            if (dVar24 <= 0.0) {
              pVVar12 = &downLocks;
              goto joined_r0x001ebaf6;
            }
            goto LAB_001ebaf8;
          }
        }
        else {
          upLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar15] =
               upLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar15] + 1.0;
          pVVar12 = &downLocks;
LAB_001ebaf8:
          pdVar5 = (pVVar12->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5[uVar15] = pdVar5[uVar15] + 1.0;
        }
LAB_001ebb12:
        iVar9 = (pIVar21->data).super_SVectorBase<double>.memused;
        lVar17 = lVar17 + 0x10;
      }
    } while (((upLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar15] != 1.0) ||
             (NAN(upLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar15]))) &&
            ((uVar19 = local_120,
             downLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar15] != 1.0 ||
             (NAN(downLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar15])))));
    local_f8 = (lp->super_LPColSetBase<double>).low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar15];
    local_100 = (lp->super_LPColSetBase<double>).up.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar15];
    lVar17 = 0;
    for (lVar20 = 0; uVar19 = local_120, lVar20 < iVar9; lVar20 = lVar20 + 1) {
      pNVar4 = (pIVar21->data).super_SVectorBase<double>.m_elem;
      local_f0 = *(double *)((long)&pNVar4->val + lVar17);
      iVar10 = *(int *)((long)&pNVar4->idx + lVar17);
      dVar24 = (lp->super_LPRowSetBase<double>).left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar10];
      dVar25 = (lp->super_LPRowSetBase<double>).right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar10];
      dVar22 = feastol(this);
      if (dVar22 < ABS(dVar24 - dVar25)) {
        pdVar11 = (double *)infinity();
        dVar22 = *pdVar11;
        pdVar11 = (double *)infinity();
        iVar9 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
                [(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[iVar10].idx].
                data.super_SVectorBase<double>.memused;
        dVar23 = 2147483647.0;
        if ((2 < iVar9) && (dVar23 = 3.0, iVar9 != 3)) {
          dVar23 = *(double *)(&DAT_002ce3f0 + (ulong)(iVar9 == 4) * 8);
        }
        if (dVar24 <= -dVar22) {
          bVar6 = false;
        }
        else {
          dVar22 = *(double *)
                    ((long)&((pIVar21->data).super_SVectorBase<double>.m_elem)->val + lVar17);
          if ((((dVar22 <= 0.0) ||
               (0.0 < (lp->super_LPColSetBase<double>).object.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar15])) ||
              (downLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar15] != 1.0)) ||
             ((NAN(downLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar15]) ||
              (bVar6 = true,
              dVar23 < upLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar15])))) {
            if (((0.0 <= dVar22) ||
                (((lp->super_LPColSetBase<double>).object.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar15] < 0.0 ||
                 (upLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar15] != 1.0)))) ||
               (NAN(upLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar15]))) {
              bVar6 = false;
            }
            else {
              bVar6 = downLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar15] <= dVar23;
            }
          }
        }
        if (*pdVar11 <= dVar25) {
LAB_001ebdf1:
          bVar7 = false;
LAB_001ebdf3:
          if (!(bool)(bVar6 | bVar7)) goto LAB_001ebfe5;
        }
        else {
          dVar22 = *(double *)
                    ((long)&((pIVar21->data).super_SVectorBase<double>.m_elem)->val + lVar17);
          if ((((dVar22 <= 0.0) ||
               ((lp->super_LPColSetBase<double>).object.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar15] < 0.0)) ||
              (upLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar15] != 1.0)) ||
             ((NAN(upLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar15]) ||
              (bVar7 = true,
              dVar23 < downLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar15])))) {
            if (((0.0 <= dVar22) ||
                ((0.0 < (lp->super_LPColSetBase<double>).object.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar15] ||
                 (downLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar15] != 1.0)))) ||
               (NAN(downLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar15]))) goto LAB_001ebdf1;
            bVar7 = upLocks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar15] <= dVar23;
            goto LAB_001ebdf3;
          }
        }
        minRes = 0.0;
        maxRes = 0.0;
        computeMinMaxResidualActivity(local_e8,lp,iVar10,(int)local_120,&minRes,&maxRes);
        this = local_e8;
        if (bVar6) {
          computeMinMaxValues(local_e8,lp,dVar24,local_f0,minRes,maxRes,&minVal,&maxVal);
          dVar24 = minVal;
          pdVar11 = (double *)infinity();
          dVar22 = minVal;
          if ((((dVar24 <= -*pdVar11) ||
               (dVar23 = feastol(this), dVar24 = maxVal, dVar22 - local_f8 <= dVar23)) ||
              (pdVar11 = (double *)infinity(), dVar22 = maxVal, *pdVar11 <= dVar24)) ||
             (dVar24 = feastol(this), -dVar24 <= dVar22 - local_100)) goto LAB_001ebf11;
          uVar18 = *(uint *)((long)&((pIVar21->data).super_SVectorBase<double>.m_elem)->idx + lVar17
                            );
          bVar6 = true;
LAB_001ec01f:
          uVar19 = local_120;
          if (-1 < (int)uVar18) {
            this_02 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                      (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[uVar18].
                      idx;
            pVVar12 = &(lp->super_LPRowSetBase<double>).right;
            if (bVar6) {
              pVVar12 = &(lp->super_LPRowSetBase<double>).left;
            }
            local_c8 = (pVVar12->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar18];
            iVar10 = (int)local_120;
            local_124 = uVar18;
            dVar25 = SVectorBase<double>::operator[]((SVectorBase<double> *)this_02,iVar10);
            this_01 = (MultiAggregationPS *)operator_new(0xa0);
            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_40,
                       &(pSVar8->_tolerances).
                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
            MultiAggregationPS::MultiAggregationPS
                      (this_01,lp,this,local_124,iVar10,local_c8,
                       (shared_ptr<soplex::Tolerances> *)&local_40);
            std::__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<soplex::SPxMainSM<double>::MultiAggregationPS,void>
                      ((__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>
                        *)&maxRes,this_01);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
            std::
            vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
            ::push_back(&this_00->data,(value_type *)&maxRes);
            uVar14 = local_124;
            for (dVar24 = 0.0;
                (long)dVar24 < (long)(pIVar21->data).super_SVectorBase<double>.memused;
                dVar24 = (double)((long)dVar24 + 1)) {
              uVar3 = (pIVar21->data).super_SVectorBase<double>.m_elem[(long)dVar24].idx;
              if (uVar3 != uVar14) {
                local_f0 = dVar24;
                VectorBase<double>::VectorBase
                          ((VectorBase<double> *)&minRes,
                           (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
                iVar10 = (pIVar21->data).super_SVectorBase<double>.m_elem[(long)dVar24].idx;
                local_f8 = (lp->super_LPRowSetBase<double>).right.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar10];
                local_100 = (lp->super_LPRowSetBase<double>).left.val.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar10];
                VectorBase<double>::operator=
                          ((VectorBase<double> *)&minRes,
                           (SVectorBase<double> *)
                           ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                           (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
                           [iVar10].idx));
                lVar17 = 0;
                uVar19 = local_120;
                for (lVar20 = 0; lVar20 < (this_02->data).super_SVectorBase<double>.memused;
                    lVar20 = lVar20 + 1) {
                  iVar10 = *(int *)((long)&((this_02->data).super_SVectorBase<double>.m_elem)->idx +
                                   lVar17);
                  if (iVar10 != (int)uVar19) {
                    iVar10 = SVectorBase<double>::pos
                                       ((SVectorBase<double> *)
                                        ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                         set.theitem +
                                        (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set
                                        .thekey[(int)uVar3].idx),iVar10);
                    pNVar4 = (this_02->data).super_SVectorBase<double>.m_elem;
                    lVar16 = (long)*(int *)((long)&pNVar4->idx + lVar17);
                    if (iVar10 < 0) {
                      minVal = (-*(double *)((long)minRes + uVar15 * 8) *
                               *(double *)((long)&pNVar4->val + lVar17)) / dVar25;
                      (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x43])
                                (lp,(ulong)uVar3,lVar16,&minVal,0);
                      uVar19 = local_120;
                    }
                    else {
                      minVal = *(double *)((long)minRes + lVar16 * 8) -
                               (*(double *)((long)minRes + uVar15 * 8) *
                               *(double *)((long)&pNVar4->val + lVar17)) / dVar25;
                      (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x43])
                                (lp,(ulong)uVar3,lVar16,&minVal);
                      uVar19 = local_120;
                    }
                  }
                  lVar17 = lVar17 + 0x10;
                }
                dVar24 = (lp->super_LPRowSetBase<double>).right.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)uVar3];
                pdVar11 = (double *)infinity();
                this = local_e8;
                if (dVar24 < *pdVar11) {
                  minVal = local_f8 - (*(double *)((long)minRes + uVar15 * 8) * local_c8) / dVar25;
                  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x36])
                            (lp,(ulong)uVar3,&minVal,0);
                }
                dVar24 = (lp->super_LPRowSetBase<double>).left.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)uVar3];
                pdVar11 = (double *)infinity();
                if (-*pdVar11 < dVar24) {
                  minVal = local_100 - (*(double *)((long)minRes + uVar15 * 8) * local_c8) / dVar25;
                  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x33])
                            (lp,(ulong)uVar3,&minVal,0);
                }
                std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                          ((_Vector_base<double,_std::allocator<double>_> *)&minRes);
                dVar24 = local_f0;
                uVar14 = local_124;
              }
            }
            lVar17 = 8;
            for (lVar20 = 0; lVar20 < (this_02->data).super_SVectorBase<double>.memused;
                lVar20 = lVar20 + 1) {
              pNVar4 = (this_02->data).super_SVectorBase<double>.m_elem;
              iVar10 = *(int *)((long)&pNVar4->val + lVar17);
              if (iVar10 != (int)uVar19) {
                pdVar5 = (lp->super_LPColSetBase<double>).object.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                minRes = pdVar5[iVar10] -
                         (pdVar5[uVar15] * *(double *)((long)pNVar4 + lVar17 + -8)) / dVar25;
                (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                  super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x27])
                          (lp,(long)iVar10,&minRes,0);
              }
              lVar17 = lVar17 + 0x10;
            }
            local_118 = (ulong)(uint)((int)local_118 +
                                     (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                                     theitem[(lp->super_LPColSetBase<double>).
                                             super_SVSetBase<double>.set.thekey[uVar15].idx].data.
                                     super_SVectorBase<double>.memused);
            removeCol(this,lp,(int)uVar19);
            iVar10 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
                     [(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[uVar18].
                      idx].data.super_SVectorBase<double>.memused;
            removeRow(this,lp,local_124);
            local_104 = local_104 + 1;
            local_118 = (ulong)(uint)((int)local_118 + iVar10);
            piVar1 = (this->m_stat).data + 0x10;
            *piVar1 = *piVar1 + 1;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
          }
          break;
        }
LAB_001ebf11:
        if (bVar7) {
          computeMinMaxValues(this,lp,dVar25,local_f0,minRes,maxRes,&minVal,&maxVal);
          dVar24 = minVal;
          pdVar11 = (double *)infinity();
          dVar25 = minVal;
          if (((-*pdVar11 < dVar24) &&
              (dVar22 = feastol(this), dVar24 = maxVal, dVar22 < dVar25 - local_f8)) &&
             ((pdVar11 = (double *)infinity(), dVar25 = maxVal, dVar24 < *pdVar11 &&
              (dVar24 = feastol(this), dVar25 - local_100 < -dVar24)))) {
            uVar18 = *(uint *)((long)&((pIVar21->data).super_SVectorBase<double>.m_elem)->idx +
                              lVar17);
            bVar6 = false;
            goto LAB_001ec01f;
          }
        }
      }
LAB_001ebfe5:
      iVar9 = (pIVar21->data).super_SVectorBase<double>.memused;
      lVar17 = lVar17 + 0x10;
      this = local_e8;
    }
  } while( true );
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::multiaggregation(SPxLPBase<R>& lp, bool& again)
{
   // this simplifier eliminates rows and columns by performing multi aggregations as identified by the constraint
   // activities.
   int remRows = 0;
   int remCols = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();
   int oldCols = lp.nCols();

   VectorBase<R> upLocks(lp.nCols());
   VectorBase<R> downLocks(lp.nCols());

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      // setting the locks on the variables
      upLocks[j] = 0;
      downLocks[j] = 0;

      if(lp.colVector(j).size() <= 1)
         continue;

      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(lp.lhs(col.index(k)) > R(-infinity) && lp.rhs(col.index(k)) < R(infinity))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(lp.lhs(col.index(k)) > R(-infinity))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(lp.rhs(col.index(k)) < R(infinity))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      // multi-aggregate column
      if(upLocks[j] == 1 || downLocks[j] == 1)
      {
         R lower = lp.lower(j);
         R upper = lp.upper(j);
         int maxOtherLocks;
         int bestpos = -1;
         bool bestislhs = true;

         for(int k = 0; k < col.size(); ++k)
         {
            int rowNumber;
            R lhs;
            R rhs;
            bool lhsExists;
            bool rhsExists;
            bool aggLhs;
            bool aggRhs;

            R val = col.value(k);

            rowNumber = col.index(k);
            lhs = lp.lhs(rowNumber);
            rhs = lp.rhs(rowNumber);

            if(EQ(lhs, rhs, feastol()))
               continue;

            lhsExists = lhs > R(-infinity);
            rhsExists = rhs < R(infinity);

            if(lp.rowVector(rowNumber).size() <= 2)
               maxOtherLocks = INT_MAX;
            else if(lp.rowVector(rowNumber).size() == 3)
               maxOtherLocks = 3;
            else if(lp.rowVector(rowNumber).size() == 4)
               maxOtherLocks = 2;
            else
               maxOtherLocks = 1;

            aggLhs = lhsExists
                     && ((col.value(k) > 0.0 && lp.maxObj(j) <= 0.0 && downLocks[j] == 1 && upLocks[j] <= maxOtherLocks)
                         || (col.value(k) < 0.0 && lp.maxObj(j) >= 0.0 && upLocks[j] == 1 && downLocks[j] <= maxOtherLocks));
            aggRhs = rhsExists
                     && ((col.value(k) > 0.0 && lp.maxObj(j) >= 0.0 && upLocks[j] == 1 && downLocks[j] <= maxOtherLocks)
                         || (col.value(k) < 0.0 && lp.maxObj(j) <= 0.0 && downLocks[j] == 1 && upLocks[j] <= maxOtherLocks));

            if(aggLhs || aggRhs)
            {
               R minRes = 0;   // this is the minimum value that the aggregation can attain
               R maxRes = 0;   // this is the maximum value that the aggregation can attain

               // computing the minimum and maximum residuals if variable j is set to zero.
               computeMinMaxResidualActivity(lp, rowNumber, j, minRes, maxRes);

               // we will try to aggregate to the lhs
               if(aggLhs)
               {
                  R minVal;
                  R maxVal;

                  // computing the values of the upper and lower bounds for the aggregated variables
                  computeMinMaxValues(lp, lhs, val, minRes, maxRes, minVal, maxVal);

                  assert(LE(minVal, maxVal, this->tolerances()->epsilon()));

                  // if the bounds of the aggregation and the original variable are equivalent, then we can reduce
                  if((minVal > R(-infinity) && GT(minVal, lower, feastol()))
                        && (maxVal < R(infinity) && LT(maxVal, upper, feastol())))
                  {
                     bestpos = col.index(k);
                     bestislhs = true;
                     break;
                  }
               }

               // we will try to aggregate to the rhs
               if(aggRhs)
               {
                  R minVal;
                  R maxVal;

                  // computing the values of the upper and lower bounds for the aggregated variables
                  computeMinMaxValues(lp, rhs, val, minRes, maxRes, minVal, maxVal);

                  assert(LE(minVal, maxVal, this->tolerances()->epsilon()));

                  if((minVal > R(-infinity) && GT(minVal, lower, feastol()))
                        && (maxVal < R(infinity) && LT(maxVal, upper, feastol())))
                  {
                     bestpos = col.index(k);
                     bestislhs = false;
                     break;
                  }
               }
            }
         }

         // it is only possible to aggregate if a best position has been found
         if(bestpos >= 0)
         {
            const SVectorBase<R>& bestRow = lp.rowVector(bestpos);
            // aggregating the variable and applying the fixings to the all other constraints
            R aggConstant = (bestislhs ? lp.lhs(bestpos) : lp.rhs(
                                bestpos));   // this is the lhs or rhs of the aggregated row
            R aggAij =
               bestRow[j];                                   // this is the coefficient of the deleted col

            SPxOut::debug(this,
                          "IMAISM51 col {}: Aggregating row: {} Aggregation Constant={} Coefficient of aggregated col={}\n",
                          j, bestpos, aggConstant, aggAij);

            std::shared_ptr<PostStep> ptr(new MultiAggregationPS(lp, *this, bestpos, j,
                                          aggConstant, this->_tolerances));
            m_hist.append(ptr);

            for(int k = 0; k < col.size(); ++k)
            {
               if(col.index(k) != bestpos)
               {
                  int rowNumber = col.index(k);
                  VectorBase<R> updateRow(lp.nCols());
                  R updateRhs = lp.rhs(col.index(k));
                  R updateLhs = lp.lhs(col.index(k));

                  updateRow = lp.rowVector(col.index(k));

                  // updating the row with the best row
                  for(int l = 0; l < bestRow.size(); l++)
                  {
                     if(bestRow.index(l) != j)
                     {
                        if(lp.rowVector(rowNumber).pos(bestRow.index(l)) >= 0)
                           lp.changeElement(rowNumber, bestRow.index(l), updateRow[bestRow.index(l)]
                                            - updateRow[j]*bestRow.value(l) / aggAij);
                        else
                           lp.changeElement(rowNumber, bestRow.index(l), -1.0 * updateRow[j]*bestRow.value(l) / aggAij);
                     }
                  }

                  // NOTE: I don't know whether we should change the LHS and RHS if they are currently at R(infinity)
                  if(lp.rhs(rowNumber) < R(infinity))
                     lp.changeRhs(rowNumber, updateRhs - updateRow[j]*aggConstant / aggAij);

                  if(lp.lhs(rowNumber) > R(-infinity))
                     lp.changeLhs(rowNumber, updateLhs - updateRow[j]*aggConstant / aggAij);

                  assert(LE(lp.lhs(rowNumber), lp.rhs(rowNumber), this->tolerances()->epsilon()));
               }
            }

            for(int l = 0; l < bestRow.size(); l++)
            {
               if(bestRow.index(l) != j)
                  lp.changeMaxObj(bestRow.index(l),
                                  lp.maxObj(bestRow.index(l)) - lp.maxObj(j)*bestRow.value(l) / aggAij);
            }

            ++remCols;
            remNzos += lp.colVector(j).size();
            removeCol(lp, j);
            ++remRows;
            remNzos += lp.rowVector(bestpos).size();
            removeRow(lp, bestpos);

            ++m_stat[MULTI_AGG];
         }
      }
   }


   assert(remRows > 0 || remCols > 0 || remNzos == 0);

   if(remCols + remRows > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (multi-aggregation) removed "
                    << remRows << " rows, "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols + remRows > this->m_minReduction * (oldCols + oldRows))
         again = true;
   }

   return this->OKAY;
}